

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1147904::CodemodelConfig::DumpDirectoryObject
          (Value *__return_storage_ptr__,CodemodelConfig *this,Directory *d)

{
  cmFileAPI *this_00;
  bool bVar1;
  string *psVar2;
  reference pcVar3;
  ulong uVar4;
  Value local_3e8;
  undefined1 local_3c0 [8];
  DirectoryObject dir;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  cmAlphaNum local_1b8;
  string local_188;
  cmAlphaNum local_168;
  cmAlphaNum local_138;
  string local_108;
  cmStateDirectory local_e8;
  undefined1 local_c0 [8];
  string buildDirRel;
  undefined1 local_78 [8];
  string sourceDirRel;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string prefix;
  Directory *d_local;
  CodemodelConfig *this_local;
  
  prefix.field_2._8_8_ = d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"directory",&local_41);
  std::allocator<char>::~allocator(&local_41);
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)((long)&buildDirRel.field_2 + 8),
             (cmStateSnapshot *)prefix.field_2._8_8_);
  psVar2 = cmStateDirectory::GetCurrentSource_abi_cxx11_
                     ((cmStateDirectory *)((long)&buildDirRel.field_2 + 8));
  RelativeIfUnder((string *)local_78,&this->TopSource,psVar2);
  cmStateSnapshot::GetDirectory(&local_e8,(cmStateSnapshot *)prefix.field_2._8_8_);
  psVar2 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_e8);
  RelativeIfUnder((string *)local_c0,&this->TopBuild,psVar2);
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_c0);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_78);
    if (!bVar1) {
      cmAlphaNum::cmAlphaNum(&local_1b8,(string *)local_40);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1,'-');
      cmStrCat<std::__cxx11::string>
                (&local_188,&local_1b8,(cmAlphaNum *)&__range1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_138,(string *)local_40);
    cmAlphaNum::cmAlphaNum(&local_168,'-');
    cmStrCat<std::__cxx11::string>
              (&local_108,&local_138,&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    if ((*pcVar3 == '/') || (*pcVar3 == '\\')) {
      *pcVar3 = '.';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &dir.Backtraces.Nodes.limit_,"-",this->Config);
    std::__cxx11::string::operator+=((string *)local_40,(string *)&dir.Backtraces.Nodes.limit_);
    std::__cxx11::string::~string((string *)&dir.Backtraces.Nodes.limit_);
  }
  DirectoryObject::DirectoryObject
            ((DirectoryObject *)local_3c0,*(cmLocalGenerator **)(prefix.field_2._8_8_ + 0x18),
             this->Config,&this->TargetIndexMap);
  this_00 = this->FileAPI;
  DirectoryObject::Dump(&local_3e8,(DirectoryObject *)local_3c0);
  cmFileAPI::MaybeJsonFile(__return_storage_ptr__,this_00,&local_3e8,(string *)local_40);
  Json::Value::~Value(&local_3e8);
  DirectoryObject::~DirectoryObject((DirectoryObject *)local_3c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Json::Value CodemodelConfig::DumpDirectoryObject(Directory& d)
{
  std::string prefix = "directory";
  std::string sourceDirRel = RelativeIfUnder(
    this->TopSource, d.Snapshot.GetDirectory().GetCurrentSource());
  std::string buildDirRel = RelativeIfUnder(
    this->TopBuild, d.Snapshot.GetDirectory().GetCurrentBinary());
  if (!cmSystemTools::FileIsFullPath(buildDirRel)) {
    prefix = cmStrCat(prefix, '-', buildDirRel);
  } else if (!cmSystemTools::FileIsFullPath(sourceDirRel)) {
    prefix = cmStrCat(prefix, '-', sourceDirRel);
  }
  for (char& c : prefix) {
    if (c == '/' || c == '\\') {
      c = '.';
    }
  }
  if (!this->Config.empty()) {
    prefix += "-" + this->Config;
  }

  DirectoryObject dir(d.LocalGenerator, this->Config, this->TargetIndexMap);
  return this->FileAPI.MaybeJsonFile(dir.Dump(), prefix);
}